

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Builder * embree::BVH8BuilderTwoLevelInstanceArraySAH_error
                    (void *param_1,Scene *param_2,GTypeMask param_3,bool param_4)

{
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"function BVH8BuilderTwoLevelInstanceArraySAH not supported by your CPU",
             &local_39);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 5;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BVH8Factory::BVH8Factory(int bfeatures, int ifeatures)
  {
    SELECT_SYMBOL_INIT_AVX(ifeatures,BVH8ColliderUserGeom);
    
    selectBuilders(bfeatures);
    selectIntersectors(ifeatures);
  }